

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

AddrOpnd * __thiscall
IRBuilder::BuildAuxArrayOpnd(IRBuilder *this,AuxArrayValue auxArrayType,uint32 auxArrayOffset)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *pJVar3;
  intptr_t address;
  JitArenaAllocator *pJVar4;
  undefined4 *puVar5;
  AddrOpnd *opnd;
  uint32 auxArrayOffset_local;
  AuxArrayValue auxArrayType_local;
  IRBuilder *this_local;
  
  if (auxArrayType < (AuxVarArrayVarCount|AuxFloatArray)) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    address = JITTimeFunctionBody::GetAuxDataAddr(pJVar3,auxArrayOffset);
    this_local = (IRBuilder *)
                 IR::AddrOpnd::New(address,AddrOpndKindDynamicAuxBufferRef,this->m_func,false,
                                   (Var)0x0);
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    pJVar4 = (JitArenaAllocator *)JITTimeFunctionBody::ReadFromAuxData(pJVar3,auxArrayOffset);
    this_local->m_funcAlloc = pJVar4;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1e67,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_local = (IRBuilder *)0x0;
  }
  return (AddrOpnd *)this_local;
}

Assistant:

IR::AddrOpnd *
IRBuilder::BuildAuxArrayOpnd(AuxArrayValue auxArrayType, uint32 auxArrayOffset)
{
    switch (auxArrayType)
    {
    case AuxArrayValue::AuxPropertyIdArray:
    case AuxArrayValue::AuxIntArray:
    case AuxArrayValue::AuxFloatArray:
    case AuxArrayValue::AuxVarsArray:
    case AuxArrayValue::AuxFuncInfoArray:
    case AuxArrayValue::AuxVarArrayVarCount:
    {
        IR::AddrOpnd * opnd = IR::AddrOpnd::New(m_func->GetJITFunctionBody()->GetAuxDataAddr(auxArrayOffset), IR::AddrOpndKindDynamicAuxBufferRef, m_func);
        opnd->m_metadata = m_func->GetJITFunctionBody()->ReadFromAuxData(auxArrayOffset);
        return opnd;
    }
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}